

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O3

void __thiscall LLVMBC::StreamState::append(StreamState *this,FCmpInst *value,bool decl)

{
  Predicate pred;
  undefined7 in_register_00000011;
  uint64_t local_48;
  Value *local_40;
  Value *local_38;
  char *local_30;
  
  if ((int)CONCAT71(in_register_00000011,decl) == 0) {
    local_48 = Value::get_tween_id((Value *)value);
    append<char_const(&)[2],unsigned_long>(this,(char (*) [2])0x1c4942,&local_48);
  }
  else {
    local_48 = Value::get_tween_id((Value *)value);
    pred = CmpInst::getPredicate(&value->super_CmpInst);
    local_30 = to_string(pred);
    local_38 = Instruction::getOperand((Instruction *)value,0);
    local_40 = Instruction::getOperand((Instruction *)value,1);
    append<char_const(&)[2],unsigned_long,char_const(&)[9],char_const*,char_const(&)[2],LLVMBC::Value*,char_const(&)[3],LLVMBC::Value*>
              (this,(char (*) [2])0x1c4942,&local_48,(char (*) [9])" = fcmp ",&local_30,
               (char (*) [2])0x1c47f6,&local_38,(char (*) [3])", ",&local_40);
  }
  return;
}

Assistant:

void StreamState::append(FCmpInst *value, bool decl)
{
	if (decl)
	{
		append("%", value->get_tween_id(), " = fcmp ", to_string(value->getPredicate()), " ", value->getOperand(0),
		       ", ", value->getOperand(1));
	}
	else
	{
		append("%", value->get_tween_id());
	}
}